

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::
ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>::
Impl<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
::Impl(Impl<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
       *this,shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
             *value)

{
  element_type *__x;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *x;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_40;
  __shared_ptr_access<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_18;
  shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  *value_local;
  Impl<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_local;
  
  local_18 = (__shared_ptr_access<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)value;
  value_local = (shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
                 *)this;
  ActionInterface<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::ActionInterface(&this->
                     super_ActionInterface<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
                   );
  (this->
  super_ActionInterface<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  )._vptr_ActionInterface = (_func_int **)&PTR__Impl_004fc080;
  __x = std::
        __shared_ptr_access<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*(local_18);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->value_before_cast_,__x);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_40,&this->value_before_cast_);
  ImplicitCast_<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&this->value_,(internal *)&local_40,x);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector(&local_40);
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}